

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArray2DCloseFailsOnException::
~TestCheckArray2DCloseFailsOnException(TestCheckArray2DCloseFailsOnException *this)

{
  TestCheckArray2DCloseFailsOnException *this_local;
  
  ~TestCheckArray2DCloseFailsOnException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		const float data[2][2] = { {0, 1}, {2, 3} };
        ThrowingObject2D obj;
        CHECK_ARRAY2D_CLOSE (data, obj, 2, 2, 0.01f);

		failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}